

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

void add_obj_to_summary(object *obj,void *closure)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  object *poVar4;
  uint8_t uVar5;
  uint uVar6;
  wchar_t wVar7;
  void *pvVar8;
  long lVar9;
  char *__s;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  cached_object_data *cache;
  cached_object_data *local_38;
  
  plVar3 = *(long **)((long)closure + 8);
  iVar2 = *(int *)((long)plVar3 + 0x1cc);
  if (iVar2 < (int)plVar3[0x3a]) {
    puVar1 = (undefined8 *)(*plVar3 + (long)iVar2 * 0x38);
    *(int *)((long)plVar3 + 0x1cc) = iVar2 + 1;
    if (*(long *)(*plVar3 + 8 + (long)iVar2 * 0x38) == 0) {
      pvVar8 = mem_alloc((long)*(int *)((long)plVar3 + 0x1d4) << 2);
      puVar1[1] = pvVar8;
    }
    if (puVar1[2] == 0) {
      pvVar8 = mem_alloc((long)*(int *)(*(long *)((long)closure + 8) + 0x1d4) << 2);
      puVar1[2] = pvVar8;
    }
    local_38 = (cached_object_data *)0x0;
    lVar12 = 0;
    do {
      lVar11 = lVar12 * 0x38;
      if (0 < *(int *)(*(long *)((long)closure + 8) + 0x40 + lVar11)) {
        lVar9 = *(long *)((long)closure + 8) + lVar11;
        lVar13 = 0;
        lVar15 = 0;
        do {
          lVar14 = (long)*(int *)(lVar9 + 0x44) * 4;
          compute_ui_entry_values_for_object
                    (*(ui_entry **)(*(long *)(lVar9 + 0x28) + lVar13 * 2),obj,*closure,&local_38,
                     (int *)(puVar1[1] + lVar14 + lVar13),(int *)(lVar14 + puVar1[2] + lVar13));
          lVar15 = lVar15 + 1;
          lVar9 = *(long *)((long)closure + 8) + lVar11;
          lVar13 = lVar13 + 4;
        } while (lVar15 < *(int *)(lVar9 + 0x40));
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    release_cached_object_data(local_38);
    if (0 < *(int *)(*(long *)((long)closure + 8) + 0x1dc)) {
      string_free((char *)*puVar1);
      __s = set_short_name(obj,(long)*(int *)(*(long *)((long)closure + 8) + 0x1dc),*closure);
      *puVar1 = __s;
      sVar10 = strlen(__s);
      *(int *)((long)puVar1 + 0x2c) = (int)sVar10;
    }
    puVar1[3] = obj;
    *(undefined4 *)(puVar1 + 4) = *(undefined4 *)((long)closure + 0x10);
    uVar5 = ignore_level_of(obj);
    if ((byte)(uVar5 - 1) < 3) {
      uVar6 = (uint)(byte)(5 - uVar5);
    }
    else {
      poVar4 = obj->known;
      if ((poVar4 == (object *)0x0) ||
         ((uVar6 = 0, poVar4->artifact == (artifact *)0x0 &&
          ((poVar4 == (object *)0x0 || (uVar6 = 1, poVar4->ego == (ego_item *)0x0)))))) {
        uVar6 = 3;
      }
    }
    *(uint *)((long)puVar1 + 0x24) = uVar6;
    wVar7 = wield_slot(obj);
    *(wchar_t *)(puVar1 + 5) = wVar7;
    wVar7 = object_char(obj);
    *(wchar_t *)(puVar1 + 6) = wVar7;
    uVar5 = object_attr(obj);
    *(uint8_t *)((long)puVar1 + 0x34) = uVar5;
    return;
  }
  __assert_fail("c->summary->nitems < c->summary->nalloc",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-equip-cmp.c"
                ,0x7ec,"void add_obj_to_summary(const struct object *, void *)");
}

Assistant:

static void add_obj_to_summary(const struct object *obj, void *closure)
{
	struct add_obj_to_summary_closure *c = closure;
	struct equippable *e;
	struct cached_object_data *cache;
	int i;

	assert(c->summary->nitems < c->summary->nalloc);
	e = c->summary->items + c->summary->nitems;
	++c->summary->nitems;

	if (!e->vals) {
		e->vals = mem_alloc(c->summary->nprop * sizeof(*e->vals));
	}
	if (!e->auxvals) {
		e->auxvals = mem_alloc(c->summary->nprop *
			sizeof(*e->auxvals));
	}
	cache = NULL;
	for (i = 0; i < (int)N_ELEMENTS(c->summary->propcats); ++i) {
		int j;

		for (j = 0; j < c->summary->propcats[i].n; ++j) {
			compute_ui_entry_values_for_object(
				c->summary->propcats[i].entries[j], obj,
				c->p, &cache,
				e->vals + j + c->summary->propcats[i].off,
				e->auxvals + j + c->summary->propcats[i].off);
		}
	}
	release_cached_object_data(cache);

	if (c->summary->nshortnm > 0) {
		string_free(e->short_name);
		e->short_name = set_short_name(obj, c->summary->nshortnm,
			c->p);
		e->nmlen = (int)strlen(e->short_name);
	}

	e->obj = obj;
	e->src = c->src;

	switch (ignore_level_of(obj)) {
	case IGNORE_GOOD:
		e->qual = EQUIP_QUAL_GOOD;
		break;

	case IGNORE_AVERAGE:
		e->qual = EQUIP_QUAL_AVERAGE;
		break;

	case IGNORE_BAD:
		e->qual = EQUIP_QUAL_BAD;
		break;

	default:
		/* Try to get some finer distinctions. */
		if (obj->known && obj->known->artifact) {
			e->qual = EQUIP_QUAL_ARTIFACT;
		} else if (obj->known && obj->known->ego) {
			e->qual = EQUIP_QUAL_EGO;
		} else {
			/* Treat unknown items as average. */
			e->qual = EQUIP_QUAL_AVERAGE;
		}
		break;
	}

	e->slot = wield_slot(obj);
	e->ch = object_char(obj);
	e->at = object_attr(obj);
}